

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_ports_linux.cc
# Opt level: O2

string * usb_sysfs_friendly_name(string *__return_storage_ptr__,string *sys_usb_path)

{
  uint device_number;
  string serial;
  string product;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string manufacturer;
  
  std::operator+(&serial,sys_usb_path,"/devnum");
  read_line(&product,&serial);
  std::__cxx11::istringstream::istringstream
            ((istringstream *)&manufacturer,(string *)&product,_S_in);
  std::istream::_M_extract<unsigned_int>((uint *)&manufacturer);
  std::__cxx11::istringstream::~istringstream((istringstream *)&manufacturer);
  std::__cxx11::string::~string((string *)&product);
  std::__cxx11::string::~string((string *)&serial);
  std::operator+(&product,sys_usb_path,"/manufacturer");
  read_line(&manufacturer,&product);
  std::__cxx11::string::~string((string *)&product);
  std::operator+(&serial,sys_usb_path,"/product");
  read_line(&product,&serial);
  std::__cxx11::string::~string((string *)&serial);
  std::operator+(&local_1b8,sys_usb_path,"/serial");
  read_line(&serial,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  if (((manufacturer._M_string_length == 0) && (product._M_string_length == 0)) &&
     (serial._M_string_length == 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_1b8);
  }
  else {
    format_abi_cxx11_(__return_storage_ptr__,"%s %s %s",manufacturer._M_dataplus._M_p,
                      product._M_dataplus._M_p,serial._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&serial);
  std::__cxx11::string::~string((string *)&product);
  std::__cxx11::string::~string((string *)&manufacturer);
  return __return_storage_ptr__;
}

Assistant:

string
usb_sysfs_friendly_name(const string& sys_usb_path)
{
    unsigned int device_number = 0;

    istringstream( read_line(sys_usb_path + "/devnum") ) >> device_number;

    string manufacturer = read_line( sys_usb_path + "/manufacturer" );

    string product = read_line( sys_usb_path + "/product" );

    string serial = read_line( sys_usb_path + "/serial" );

    if( manufacturer.empty() && product.empty() && serial.empty() )
        return "";

    return format("%s %s %s", manufacturer.c_str(), product.c_str(), serial.c_str() );
}